

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O2

QFixed __thiscall QFontEngine::lineThickness(QFontEngine *this)

{
  int iVar1;
  int iVar2;
  
  iVar2 = (int)(((double)((uint)((ulong)*(undefined8 *)&(this->fontDef).field_0x60 >> 0x28) & 0x3ff)
                * (this->fontDef).pixelSize) / 10.0);
  iVar1 = iVar2 / 700;
  iVar1 = (iVar1 + (uint)(iVar1 == 0)) * 0x40;
  if (iVar2 - 0x41aU < 0x15e) {
    iVar1 = 0x80;
  }
  return (QFixed)iVar1;
}

Assistant:

QFixed QFontEngine::lineThickness() const
{
    // ad hoc algorithm
    int score = fontDef.weight * fontDef.pixelSize / 10;
    int lw = score / 700;

    // looks better with thicker line for small pointsizes
    if (lw < 2 && score >= 1050) lw = 2;
    if (lw == 0) lw = 1;

    return lw;
}